

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::resize
          (VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_> *this,
          size_t newCount)

{
  unsigned_long *puVar1;
  VkMappedMemoryRange *__dest;
  PFN_vkReallocationFunction in_RSI;
  VkAllocationCallbacks *in_RDI;
  size_t elementsToCopy;
  VkMappedMemoryRange *newArray;
  size_t newCapacity;
  size_t in_stack_ffffffffffffffb8;
  VkMappedMemoryRange *ptr;
  unsigned_long local_28;
  ulong local_20;
  PFN_vkFreeFunction local_18;
  PFN_vkReallocationFunction local_10 [2];
  
  local_18 = in_RDI->pfnFree;
  local_10[0] = in_RSI;
  if (in_RDI->pfnFree < in_RSI) {
    local_20 = (ulong)((long)in_RDI->pfnFree * 3) >> 1;
    local_28 = 8;
    puVar1 = std::max<unsigned_long>(&local_20,&local_28);
    puVar1 = std::max<unsigned_long>((unsigned_long *)local_10,puVar1);
    local_18 = (PFN_vkFreeFunction)*puVar1;
  }
  if (local_18 != in_RDI->pfnFree) {
    if (local_18 == (PFN_vkFreeFunction)0x0) {
      __dest = (VkMappedMemoryRange *)0x0;
    }
    else {
      __dest = VmaAllocateArray<VkMappedMemoryRange>(in_RDI,in_stack_ffffffffffffffb8);
    }
    ptr = __dest;
    puVar1 = std::min<unsigned_long>
                       ((unsigned_long *)&in_RDI->pfnReallocation,(unsigned_long *)local_10);
    if (*puVar1 != 0) {
      memcpy(__dest,in_RDI->pfnAllocation,*puVar1 * 0x28);
    }
    VmaFree(in_RDI,ptr);
    in_RDI->pfnFree = local_18;
    in_RDI->pfnAllocation = (PFN_vkAllocationFunction)__dest;
  }
  in_RDI->pfnReallocation = local_10[0];
  return;
}

Assistant:

void VmaVector<T, AllocatorT>::resize(size_t newCount)
{
    size_t newCapacity = m_Capacity;
    if (newCount > m_Capacity)
    {
        newCapacity = VMA_MAX(newCount, VMA_MAX(m_Capacity * 3 / 2, (size_t)8));
    }

    if (newCapacity != m_Capacity)
    {
        T* const newArray = newCapacity ? VmaAllocateArray<T>(m_Allocator.m_pCallbacks, newCapacity) : VMA_NULL;
        const size_t elementsToCopy = VMA_MIN(m_Count, newCount);
        if (elementsToCopy != 0)
        {
            memcpy(newArray, m_pArray, elementsToCopy * sizeof(T));
        }
        VmaFree(m_Allocator.m_pCallbacks, m_pArray);
        m_Capacity = newCapacity;
        m_pArray = newArray;
    }

    m_Count = newCount;
}